

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_aggregator.cpp
# Opt level: O2

void __thiscall
duckdb::WindowAggregatorLocalState::Finalize
          (WindowAggregatorLocalState *this,WindowAggregatorGlobalState *gastate,
          CollectionPtr collection)

{
  pointer __p;
  WindowCollection *args;
  optional_ptr<duckdb::WindowCollection,_true> local_20;
  pointer local_18;
  
  if ((this->cursor).
      super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
      super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
      super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl == (WindowCursor *)0x0) {
    local_20.ptr = collection.ptr;
    args = optional_ptr<duckdb::WindowCollection,_true>::operator*(&local_20);
    make_uniq<duckdb::WindowCursor,duckdb::WindowCollection&,duckdb::vector<unsigned_long,true>const&>
              ((duckdb *)&local_18,args,&gastate->aggregator->child_idx);
    __p = local_18;
    local_18 = (pointer)0x0;
    ::std::__uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>::reset
              ((__uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_> *)
               &this->cursor,__p);
    ::std::unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>::~unique_ptr
              ((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_> *)
               &local_18);
  }
  return;
}

Assistant:

void WindowAggregatorLocalState::Finalize(WindowAggregatorGlobalState &gastate, CollectionPtr collection) {
	// Prepare to scan
	if (!cursor) {
		cursor = make_uniq<WindowCursor>(*collection, gastate.aggregator.child_idx);
	}
}